

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate_catalog_entry.hpp
# Opt level: O2

void __thiscall
duckdb::CollateCatalogEntry::CollateCatalogEntry
          (CollateCatalogEntry *this,Catalog *catalog,SchemaCatalogEntry *schema,
          CreateCollationInfo *info)

{
  string sStack_48;
  
  ::std::__cxx11::string::string((string *)&sStack_48,(string *)&info->name);
  StandardEntry::StandardEntry(&this->super_StandardEntry,COLLATION_ENTRY,schema,catalog,&sStack_48)
  ;
  ::std::__cxx11::string::~string((string *)&sStack_48);
  (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry =
       (_func_int **)&PTR__CollateCatalogEntry_0279ba20;
  ScalarFunction::ScalarFunction(&this->function,&info->function);
  this->combinable = info->combinable;
  this->not_required_for_equality = info->not_required_for_equality;
  return;
}

Assistant:

CollateCatalogEntry(Catalog &catalog, SchemaCatalogEntry &schema, CreateCollationInfo &info)
	    : StandardEntry(CatalogType::COLLATION_ENTRY, schema, catalog, info.name), function(info.function),
	      combinable(info.combinable), not_required_for_equality(info.not_required_for_equality) {
	}